

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O0

CoeffReturnType __thiscall
Eigen::internal::
product_evaluator<Eigen::Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_2,_false>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
::coeff(product_evaluator<Eigen::Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        *this,Index index)

{
  Scalar SVar1;
  ConstColXpr local_240;
  ConstRowXpr local_210;
  ConstTransposeReturnType local_180;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_1,_2,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_2,_1,_true>_>
  local_f0;
  undefined8 local_28;
  Index col;
  Index row;
  Index index_local;
  product_evaluator<Eigen::Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  *this_local;
  
  local_28 = 0;
  col = index;
  row = index;
  index_local = (Index)this;
  DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_2,_false>_>
  ::row(&local_210,
        (DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>_>
         *)this,index);
  DenseBase<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_2,_false>,_1,_2,_false>_>
  ::transpose(&local_180,
              (DenseBase<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_1,_2,_false>_>
               *)&local_210);
  DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::col
            (&local_240,(DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)this->m_rhs,0);
  MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>,-1,2,false>const,1,2,false>const>>
  ::cwiseProduct<Eigen::Block<Eigen::Matrix<double,2,1,0,2,1>const,2,1,true>>
            (&local_f0,&local_180,
             (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_2,_1,_true>_> *)
             &local_240);
  SVar1 = DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_2,_false>,_1,_2,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_2,_1,_true>_>_>
          ::sum((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_1,_2,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_2,_1,_true>_>_>
                 *)&local_f0);
  return SVar1;
}

Assistant:

const CoeffReturnType coeff(Index index) const
  {
    const Index row = (RowsAtCompileTime == 1 || MaxRowsAtCompileTime==1) ? 0 : index;
    const Index col = (RowsAtCompileTime == 1 || MaxRowsAtCompileTime==1) ? index : 0;
    return (m_lhs.row(row).transpose().cwiseProduct( m_rhs.col(col) )).sum();
  }